

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void transferParseError(Parse *pTo,Parse *pFrom)

{
  if (pTo->nErr != 0) {
    sqlite3DbFree(pFrom->db,pFrom->zErrMsg);
    return;
  }
  pTo->zErrMsg = pFrom->zErrMsg;
  pTo->nErr = pFrom->nErr;
  pTo->rc = pFrom->rc;
  return;
}

Assistant:

static void transferParseError(Parse *pTo, Parse *pFrom){
  assert( pFrom->zErrMsg==0 || pFrom->nErr );
  assert( pTo->zErrMsg==0 || pTo->nErr );
  if( pTo->nErr==0 ){
    pTo->zErrMsg = pFrom->zErrMsg;
    pTo->nErr = pFrom->nErr;
    pTo->rc = pFrom->rc;
  }else{
    sqlite3DbFree(pFrom->db, pFrom->zErrMsg);
  }
}